

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Counts *pCVar1;
  size_t *psVar2;
  IStreamingReporter *pIVar3;
  undefined8 _totals;
  int iVar4;
  SectionTracker *pSVar5;
  IMutableContext *pIVar6;
  TestCaseStats local_358;
  undefined1 local_1c8 [8];
  TestCaseInfo testInfo;
  Totals prevTotals;
  undefined1 local_78 [8];
  string redirectedCout;
  string redirectedCerr;
  
  testInfo._264_8_ = (this->m_totals).assertions.passed;
  local_78 = (undefined1  [8])&redirectedCout._M_string_length;
  redirectedCout._M_dataplus._M_p = (pointer)0x0;
  redirectedCout._M_string_length._0_1_ = 0;
  redirectedCout.field_2._8_8_ = &redirectedCerr._M_string_length;
  redirectedCerr._M_dataplus._M_p = (pointer)0x0;
  redirectedCerr._M_string_length._0_1_ = 0;
  redirectedCerr.field_2._8_8_ = __return_storage_ptr__;
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)local_1c8,&testCase->super_TestCaseInfo);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,local_1c8);
  this->m_activeTestCase = testCase;
  do {
    TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      pSVar5 = TestCaseTracking::SectionTracker::acquire
                         (&this->m_trackerContext,(string *)local_1c8);
      this->m_testCaseTracker = (ITracker *)pSVar5;
      runCurrentTest(this,(string *)local_78,(string *)((long)&redirectedCout.field_2 + 8));
      iVar4 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar4 != '\0') break;
      iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
    } while ((char)iVar4 == '\0');
    pIVar6 = getCurrentMutableContext();
    iVar4 = (*(pIVar6->super_IContext)._vptr_IContext[5])(pIVar6);
    if ((char)iVar4 == '\0') break;
    iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  } while ((char)iVar4 == '\0');
  Totals::delta((Totals *)redirectedCerr.field_2._8_8_,&this->m_totals,
                (Totals *)&testInfo.properties);
  _totals = redirectedCerr.field_2._8_8_;
  if ((*(long *)(redirectedCerr.field_2._8_8_ + 0x18) != 0 & (byte)testInfo.lineInfo.line >> 2) == 1
     ) {
    *(long *)(redirectedCerr.field_2._8_8_ + 8) = *(long *)(redirectedCerr.field_2._8_8_ + 8) + 1;
    *(long *)(redirectedCerr.field_2._8_8_ + 0x18) =
         *(long *)(redirectedCerr.field_2._8_8_ + 0x18) + -1;
    *(long *)(redirectedCerr.field_2._8_8_ + 0x20) =
         *(long *)(redirectedCerr.field_2._8_8_ + 0x20) + 1;
  }
  pCVar1 = &(this->m_totals).testCases;
  pCVar1->passed = pCVar1->passed + *(long *)(redirectedCerr.field_2._8_8_ + 0x18);
  psVar2 = &(this->m_totals).testCases.failed;
  *psVar2 = *psVar2 + *(long *)(redirectedCerr.field_2._8_8_ + 0x20);
  psVar2 = &(this->m_totals).testCases.failedButOk;
  *psVar2 = *psVar2 + *(long *)(redirectedCerr.field_2._8_8_ + 0x28);
  pIVar3 = (this->m_reporter).m_p;
  iVar4 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  TestCaseStats::TestCaseStats
            (&local_358,(TestCaseInfo *)local_1c8,(Totals *)_totals,(string *)local_78,
             (string *)((long)&redirectedCout.field_2 + 8),SUB41(iVar4,0));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,&local_358);
  TestCaseStats::~TestCaseStats(&local_358);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)local_1c8);
  if ((size_type *)redirectedCout.field_2._8_8_ != &redirectedCerr._M_string_length) {
    operator_delete((void *)redirectedCout.field_2._8_8_,
                    CONCAT71(redirectedCerr._M_string_length._1_7_,
                             (undefined1)redirectedCerr._M_string_length) + 1);
  }
  if (local_78 != (undefined1  [8])&redirectedCout._M_string_length) {
    operator_delete((void *)local_78,
                    CONCAT71(redirectedCout._M_string_length._1_7_,
                             (undefined1)redirectedCout._M_string_length) + 1);
  }
  return (Totals *)_totals;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }